

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfuturewatcher.cpp
# Opt level: O0

bool __thiscall QFutureWatcherBase::event(QFutureWatcherBase *this,QEvent *event)

{
  Type TVar1;
  QFutureCallOutEvent *in_RSI;
  QFutureWatcherBasePrivate *in_RDI;
  QFutureCallOutEvent *callOutEvent;
  QFutureWatcherBasePrivate *d;
  QObject *in_stack_00000030;
  undefined1 local_1;
  
  d_func((QFutureWatcherBase *)0x6e6be1);
  TVar1 = QEvent::type(&in_RSI->super_QEvent);
  if (TVar1 == FutureCallOut) {
    QFutureWatcherBasePrivate::sendCallOutEvent(in_RDI,in_RSI);
    local_1 = true;
  }
  else {
    local_1 = QObject::event(in_stack_00000030,(QEvent *)this);
  }
  return local_1;
}

Assistant:

bool QFutureWatcherBase::event(QEvent *event)
{
    Q_D(QFutureWatcherBase);
    if (event->type() == QEvent::FutureCallOut) {
        QFutureCallOutEvent *callOutEvent = static_cast<QFutureCallOutEvent *>(event);
        d->sendCallOutEvent(callOutEvent);
        return true;
    }
    return QObject::event(event);
}